

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::BinaryOp::BinaryOp(BinaryOp *this,Token *t,int p,int a,int line)

{
  Token local_58;
  int local_24;
  int local_20;
  int line_local;
  int a_local;
  int p_local;
  Token *t_local;
  BinaryOp *this_local;
  
  local_24 = line;
  local_20 = a;
  line_local = p;
  _a_local = t;
  t_local = (Token *)this;
  token::Token::Token(&local_58,t);
  Op::Op(&this->super_Op,&local_58,line_local,local_20,local_24,BinaryOpType);
  token::Token::~Token(&local_58);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__BinaryOp_001e1610;
  this->RightOp = (Expr *)0x0;
  this->LeftOp = (Expr *)0x0;
  return;
}

Assistant:

BinaryOp(Token t, int p, int a, int line)
        :Op(t, p, a, line, NodeType::BinaryOpType), RightOp{nullptr}, LeftOp{nullptr} {}